

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitContBind(PrintExpressionContents *this,ContBind *curr)

{
  Type *this_00;
  bool bVar1;
  HeapType HVar2;
  string_view str;
  
  bVar1 = wasm::Type::isContinuation(&curr->cont->type);
  if (bVar1) {
    this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)91>).super_Expression.type;
    bVar1 = wasm::Type::isContinuation(this_00);
    if (bVar1) {
      str._M_str = "cont.bind ";
      str._M_len = 10;
      printMedium(this->o,str);
      HVar2 = wasm::Type::getHeapType(&curr->cont->type);
      printHeapTypeName(this,HVar2);
      std::operator<<(this->o,' ');
      HVar2 = wasm::Type::getHeapType(this_00);
      printHeapTypeName(this,HVar2);
      return;
    }
  }
  __assert_fail("curr->cont->type.isContinuation() && curr->type.isContinuation()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                ,0x9f9,"void wasm::PrintExpressionContents::visitContBind(ContBind *)");
}

Assistant:

void visitContBind(ContBind* curr) {
    assert(curr->cont->type.isContinuation() && curr->type.isContinuation());
    printMedium(o, "cont.bind ");
    printHeapTypeName(curr->cont->type.getHeapType());
    o << ' ';
    printHeapTypeName(curr->type.getHeapType());
  }